

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxml_reporter.c
# Opt level: O3

void xml_reporter_start_test(TestReporter *reporter,char *testname)

{
  void *memo;
  CgreenBreadcrumb *breadcrumb;
  long lVar1;
  undefined8 uVar2;
  xmlChar *pxVar3;
  FILE *pFVar4;
  
  memo = reporter->memo;
  lVar1 = (long)context_stack_p;
  uVar2 = xmlNewChild((&child_output_tmpfile)[lVar1 * 5],0,"testcase",0);
  *(undefined8 *)(&DAT_00117f68 + lVar1 * 0x28) = uVar2;
  pxVar3 = xmlEscapePropValue(testname);
  xmlNewProp(*(undefined8 *)(&DAT_00117f68 + lVar1 * 0x28),"name",pxVar3);
  (*_xmlFree)(pxVar3);
  breadcrumb = reporter->breadcrumb;
  *(int *)((long)memo + 8) = breadcrumb->depth + -1;
  suite_path[0] = '\0';
  walk_breadcrumb(breadcrumb,print_path_segment_walker,memo);
  pxVar3 = xmlEscapePropValue(suite_path);
  xmlNewProp(*(undefined8 *)(&DAT_00117f68 + lVar1 * 0x28),"classname",pxVar3);
  (*_xmlFree)(pxVar3);
  reporter_start_test(reporter,testname);
  pFVar4 = tmpfile();
  child_output_tmpfile = (FILE *)pFVar4;
  uVar2 = xmlGetCharEncodingHandler(1);
  uVar2 = xmlOutputBufferCreateFile(pFVar4,uVar2);
  child_output_writer = (xmlTextWriterPtr)xmlNewTextWriter(uVar2);
  return;
}

Assistant:

static void xml_reporter_start_test(TestReporter *reporter, const char *testname) {
    XmlMemo *memo = (XmlMemo *)reporter->memo;
    struct xml_suite_context *ctx = &context_stack[context_stack_p-1];

    ctx->curTest = xmlNewChild(ctx->suite, NULL, XMLSTRING("testcase"), NULL);
    xmlChar *xml_testname = xmlEscapePropValue(testname);
    xmlNewProp(ctx->curTest, XMLSTRING("name"), xml_testname);
    xmlFree(xml_testname);

    memo->segment_count = reporter->breadcrumb->depth - 1;
    suite_path[0] = '\0';
    walk_breadcrumb(reporter->breadcrumb, print_path_segment_walker, memo);
    xmlChar* xml_suite_path = xmlEscapePropValue(suite_path);
    xmlNewProp(ctx->curTest, XMLSTRING("classname"), xml_suite_path);
    xmlFree(xml_suite_path);

    reporter_start_test(reporter, testname);

    child_output_tmpfile = tmpfile();
    xmlOutputBufferPtr tmpfileBuf
        = xmlOutputBufferCreateFile(child_output_tmpfile,
                                    xmlGetCharEncodingHandler(XML_CHAR_ENCODING_UTF8));
    child_output_writer = xmlNewTextWriter(tmpfileBuf);
}